

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Page::move_once(Page *this,Direction *direction_1,Direction *direction_2,bool *end_game)

{
  pointer ppSVar1;
  bool bVar2;
  Direction direction;
  int i;
  ulong uVar3;
  const_iterator __position;
  Snake *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar3 = 0;
  do {
    ppSVar1 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar3) {
      check_end_game(this,end_game);
      return;
    }
    pSVar4 = ppSVar1[uVar3];
    if (pSVar4->bot == true) {
      direction = determine_direction_move_bot(this,pSVar4);
    }
    else {
      std::__cxx11::string::string((string *)&local_50,(string *)&pSVar4->name);
      bVar2 = std::operator==(&local_50,"PLAYER 1");
      std::__cxx11::string::~string((string *)&local_50);
      pSVar4 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      if (bVar2) {
        direction = *direction_1;
      }
      else {
        direction = *direction_2;
      }
    }
    Snake::move(pSVar4,direction);
    handle_crash_wall(this,(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar3]);
    handle_eat_food(this,(this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar3]);
    ppSVar1 = (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar4 = ppSVar1[uVar3];
    bVar2 = Snake::check_crash_to_self_body(pSVar4);
    if (bVar2) {
      __position._M_current = ppSVar1 + uVar3;
LAB_0010338e:
      std::vector<Snake_*,_std::allocator<Snake_*>_>::erase(&this->snakes,__position);
    }
    else {
      bVar2 = check_crash_to_another_snakes_body(this,pSVar4);
      __position._M_current =
           (this->snakes).super__Vector_base<Snake_*,_std::allocator<Snake_*>_>._M_impl.
           super__Vector_impl_data._M_start + uVar3;
      if (bVar2) goto LAB_0010338e;
      check_and_handle_crash_to_another_snakes_head(this,*__position._M_current);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void Page::move_once(Direction& direction_1, Direction& direction_2, bool &end_game)
{
	for(int i = 0; i < snakes.size(); i++)
	{
		if(snakes[i]->is_bot())
		{
			snakes[i]->move(determine_direction_move_bot(snakes[i]));
		}
		else
		{
			if(snakes[i]->get_name() == "PLAYER 1")
				snakes[i]->move(direction_1);

			else					
				snakes[i]->move(direction_2);
		}
		
		handle_crash_wall(snakes[i]);
		handle_eat_food(snakes[i]);

		if(snakes[i]->check_crash_to_self_body())
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}
				
		if(check_crash_to_another_snakes_body(snakes[i]))
		{
			snakes.erase(snakes.begin() + i);
			continue;
		}

		check_and_handle_crash_to_another_snakes_head(snakes[i]);
	}

	check_end_game(end_game);
}